

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationRootElements::getTertiaryAfter
          (CollationRootElements *this,int32_t index,uint32_t s,uint32_t t)

{
  uint uVar1;
  uint32_t uVar2;
  uint *puVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  long lVar7;
  
  if (index == 0) {
    puVar6 = this->elements;
    if (s == 0) {
      uVar2 = 0x4000;
      puVar5 = puVar6;
    }
    else {
      uVar2 = (puVar6[4] & 0xff) << 8;
      puVar5 = puVar6 + 1;
    }
    lVar7 = (long)(int)*puVar5;
    uVar4 = puVar6[lVar7] & 0xffffff7f;
  }
  else {
    puVar6 = this->elements;
    lVar7 = (long)index;
    uVar4 = puVar6[lVar7 + 1] & 0xffffff7f;
    if (0x50004ff < uVar4) {
      uVar4 = 0x5000500;
    }
    if (-1 < (char)puVar6[lVar7 + 1]) {
      uVar4 = 0x5000500;
    }
    uVar2 = (puVar6[4] & 0xff) << 8;
  }
  puVar3 = puVar6 + lVar7;
  do {
    puVar3 = puVar3 + 1;
    if ((s << 0x10 | t) < uVar4) {
      return uVar4 & 0xffff;
    }
    uVar1 = *puVar3;
  } while (((char)uVar1 < '\0') && (uVar4 = uVar1 & 0xffffff7f, uVar1 >> 0x10 <= s));
  return uVar2;
}

Assistant:

uint32_t
CollationRootElements::getTertiaryAfter(int32_t index, uint32_t s, uint32_t t) const {
    uint32_t secTer;
    uint32_t terLimit;
    if(index == 0) {
        // primary = 0
        if(s == 0) {
            U_ASSERT(t != 0);
            index = (int32_t)elements[IX_FIRST_TERTIARY_INDEX];
            // Gap at the end of the tertiary CE range.
            terLimit = 0x4000;
        } else {
            index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
            // Gap for tertiaries of primary/secondary CEs.
            terLimit = getTertiaryBoundary();
        }
        secTer = elements[index] & ~SEC_TER_DELTA_FLAG;
    } else {
        U_ASSERT(index >= (int32_t)elements[IX_FIRST_PRIMARY_INDEX]);
        secTer = getFirstSecTerForPrimary(index + 1);
        // If this is an explicit sec/ter unit, then it will be read once more.
        terLimit = getTertiaryBoundary();
    }
    uint32_t st = (s << 16) | t;
    for(;;) {
        if(secTer > st) {
            U_ASSERT((secTer >> 16) == s);
            return secTer & 0xffff;
        }
        secTer = elements[++index];
        // No tertiary greater than t for this primary+secondary.
        if((secTer & SEC_TER_DELTA_FLAG) == 0 || (secTer >> 16) > s) { return terLimit; }
        secTer &= ~SEC_TER_DELTA_FLAG;
    }
}